

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,integer_type i,
          integer_format_info *fmt,source_location *loc)

{
  uint *puVar1;
  integer_format iVar2;
  long lVar3;
  ostream *poVar4;
  serialization_error *psVar5;
  uint uVar6;
  integer_format c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  string *psVar7;
  ulong uVar8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __tmp;
  pointer pcVar9;
  allocator<char> local_579;
  string tmp;
  anon_class_8_1_ba1d47ed insert_spacer;
  string local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  string retval;
  undefined1 local_4f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  string local_4c8 [32];
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  ostringstream oss;
  long lStack_378;
  uint auStack_370 [88];
  source_location local_210;
  source_location local_198;
  source_location local_120;
  source_location local_a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  set_locale((serializer<toml::type_config> *)local_4f0,(ostream *)this);
  std::locale::~locale((locale *)local_4f0);
  retval._M_dataplus._M_p = (pointer)&retval.field_2;
  retval._M_string_length = 0;
  retval.field_2._M_local_buf[0] = '\0';
  iVar2 = fmt->fmt;
  insert_spacer.fmt = fmt;
  if (iVar2 == dec) {
    *(long *)((long)&lStack_378 + *(long *)(_oss + -0x18)) = (long)(int)fmt->width;
    *(uint *)((long)auStack_370 + *(long *)(_oss + -0x18)) =
         *(uint *)((long)auStack_370 + *(long *)(_oss + -0x18)) & 0xffffffb5 | 2;
    std::ostream::_M_insert<long>((long)&oss);
    std::__cxx11::stringbuf::str();
    operator()::anon_class_8_1_ba1d47ed::operator()(&tmp,&insert_spacer,&local_468);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&retval,&tmp);
    std::__cxx11::string::~string((string *)&tmp);
    std::__cxx11::string::~string((string *)&local_468);
    if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&retval,'_');
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&retval,&fmt->suffix);
    }
  }
  else {
    if (i < 0) {
      psVar5 = (serialization_error *)__cxa_allocate_exception(0xa0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c8,
                 "binary, octal, hexadecimal integer does not allow negative value",
                 (allocator<char> *)&tmp);
      source_location::source_location(&local_a8,loc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e8,"here",(allocator<char> *)&local_530);
      format_error<>(&local_3a8,&local_3c8,&local_a8,&local_3e8);
      source_location::source_location(&local_120,loc);
      serialization_error::serialization_error(psVar5,&local_3a8,&local_120);
      __cxa_throw(psVar5,&serialization_error::typeinfo,serialization_error::~serialization_error);
    }
    if (iVar2 == bin) {
      tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
      tmp._M_string_length = 0;
      tmp.field_2._M_local_buf[0] = '\0';
      uVar8 = 0;
      for (; i != 0; i = (ulong)i >> 1) {
        if ((uVar8 != 0 && fmt->spacer != 0) && (uVar8 % fmt->spacer == 0)) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&tmp,'_');
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&tmp,(byte)i & 1 | 0x30);
        uVar8 = uVar8 + 1;
      }
      for (; uVar8 < fmt->width; uVar8 = uVar8 + 1) {
        if ((uVar8 != 0 && fmt->spacer != 0) && (uVar8 % fmt->spacer == 0)) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&tmp,'_');
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&tmp,'0');
      }
      for (pcVar9 = tmp._M_dataplus._M_p + tmp._M_string_length; pcVar9 != tmp._M_dataplus._M_p;
          pcVar9 = pcVar9 + -1) {
        std::operator<<((ostream *)&oss,pcVar9[-1]);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,"0b",&local_579);
      std::__cxx11::stringbuf::str();
      std::operator+(&local_530,&local_550,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_4f0 + 8));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&retval,&local_530);
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::string::~string((string *)(local_4f0 + 8));
      std::__cxx11::string::~string((string *)&local_550);
      psVar7 = &tmp;
    }
    else {
      if (iVar2 == oct) {
        *(long *)((long)&lStack_378 + *(long *)(_oss + -0x18)) = (long)(int)fmt->width;
        poVar4 = std::operator<<(&oss,0x30);
        *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 0x40;
        std::ostream::_M_insert<long>((long)poVar4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_530,"0o",(allocator<char> *)(local_4f0 + 8));
        std::__cxx11::stringbuf::str();
        operator()::anon_class_8_1_ba1d47ed::operator()(&local_550,&insert_spacer,&local_4a8);
        std::operator+(&tmp,&local_530,&local_550);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&retval,&tmp);
        std::__cxx11::string::~string((string *)&tmp);
        std::__cxx11::string::~string((string *)&local_550);
        psVar7 = &local_4a8;
      }
      else {
        if (iVar2 != hex) {
          psVar5 = (serialization_error *)__cxa_allocate_exception(0xa0);
          to_string_abi_cxx11_(&tmp,(toml *)(ulong)fmt->fmt,c);
          std::operator+(&local_428,"none of dec, hex, oct, bin: ",&tmp);
          source_location::source_location(&local_198,loc);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_448,"here",(allocator<char> *)&local_530);
          format_error<>(&local_408,&local_428,&local_198,&local_448);
          source_location::source_location(&local_210,loc);
          serialization_error::serialization_error(psVar5,&local_408,&local_210);
          __cxa_throw(psVar5,&serialization_error::typeinfo,
                      serialization_error::~serialization_error);
        }
        puVar1 = (uint *)((long)auStack_370 + *(long *)(_oss + -0x18));
        *puVar1 = *puVar1 & 0xfffffdff;
        *(long *)((long)&lStack_378 + *(long *)(_oss + -0x18)) = (long)(int)fmt->width;
        poVar4 = std::operator<<(&oss,0x30);
        *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
        lVar3 = *(long *)(_oss + -0x18);
        if (fmt->uppercase == true) {
          uVar6 = *(uint *)((long)auStack_370 + lVar3) | 0x4000;
        }
        else {
          uVar6 = *(uint *)((long)auStack_370 + lVar3) & 0xffffbfff;
        }
        *(uint *)((long)auStack_370 + lVar3) = uVar6;
        std::ostream::_M_insert<long>((long)&oss);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_530,"0x",(allocator<char> *)(local_4f0 + 8));
        std::__cxx11::stringbuf::str();
        operator()::anon_class_8_1_ba1d47ed::operator()(&local_550,&insert_spacer,&local_488);
        std::operator+(&tmp,&local_530,&local_550);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&retval,&tmp);
        std::__cxx11::string::~string((string *)&tmp);
        std::__cxx11::string::~string((string *)&local_550);
        psVar7 = &local_488;
      }
      std::__cxx11::string::~string((string *)psVar7);
      psVar7 = &local_530;
    }
    std::__cxx11::string::~string((string *)psVar7);
  }
  std::__cxx11::string::string(local_4c8,&retval);
  string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
            (__return_storage_ptr__,(detail *)local_4c8,s);
  std::__cxx11::string::~string(local_4c8);
  std::__cxx11::string::~string((string *)&retval);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

string_type operator()(const integer_type i, const integer_format_info& fmt, const source_location& loc) // {{{
    {
        std::ostringstream oss;
        this->set_locale(oss);

        const auto insert_spacer = [&fmt](std::string s) -> std::string {
            if(fmt.spacer == 0) {return s;}

            std::string sign;
            if( ! s.empty() && (s.at(0) == '+' || s.at(0) == '-'))
            {
                sign += s.at(0);
                s.erase(s.begin());
            }

            std::string spaced;
            std::size_t counter = 0;
            for(auto iter = s.rbegin(); iter != s.rend(); ++iter)
            {
                if(counter != 0 && counter % fmt.spacer == 0)
                {
                    spaced += '_';
                }
                spaced += *iter;
                counter += 1;
            }
            if(!spaced.empty() && spaced.back() == '_') {spaced.pop_back();}

            s.clear();
            std::copy(spaced.rbegin(), spaced.rend(), std::back_inserter(s));
            return sign + s;
        };

        std::string retval;
        if(fmt.fmt == integer_format::dec)
        {
            oss << std::setw(static_cast<int>(fmt.width)) << std::dec << i;
            retval = insert_spacer(oss.str());

            if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
            {
                retval += '_';
                retval += fmt.suffix;
            }
        }
        else
        {
            if(i < 0)
            {
                throw serialization_error(format_error("binary, octal, hexadecimal "
                    "integer does not allow negative value", loc, "here"), loc);
            }
            switch(fmt.fmt)
            {
                case integer_format::hex:
                {
                    oss << std::noshowbase
                        << std::setw(static_cast<int>(fmt.width))
                        << std::setfill('0')
                        << std::hex;
                    if(fmt.uppercase)
                    {
                        oss << std::uppercase;
                    }
                    else
                    {
                        oss << std::nouppercase;
                    }
                    oss << i;
                    retval = std::string("0x") + insert_spacer(oss.str());
                    break;
                }
                case integer_format::oct:
                {
                    oss << std::setw(static_cast<int>(fmt.width)) << std::setfill('0') << std::oct << i;
                    retval = std::string("0o") + insert_spacer(oss.str());
                    break;
                }
                case integer_format::bin:
                {
                    integer_type x{i};
                    std::string tmp;
                    std::size_t bits(0);
                    while(x != 0)
                    {
                        if(fmt.spacer != 0)
                        {
                            if(bits != 0 && (bits % fmt.spacer) == 0) {tmp += '_';}
                        }
                        if(x % 2 == 1) { tmp += '1'; } else { tmp += '0'; }
                        x >>= 1;
                        bits += 1;
                    }
                    for(; bits < fmt.width; ++bits)
                    {
                        if(fmt.spacer != 0)
                        {
                            if(bits != 0 && (bits % fmt.spacer) == 0) {tmp += '_';}
                        }
                        tmp += '0';
                    }
                    for(auto iter = tmp.rbegin(); iter != tmp.rend(); ++iter)
                    {
                        oss << *iter;
                    }
                    retval = std::string("0b") + oss.str();
                    break;
                }
                default:
                {
                    throw serialization_error(format_error(
                        "none of dec, hex, oct, bin: " + to_string(fmt.fmt),
                        loc, "here"), loc);
                }
            }
        }
        return string_conv<string_type>(retval);
    }